

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_predset(DisasContext_conflict1 *s,int esz,int rd,int pat,_Bool setflag)

{
  uint fullsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  int iVar2;
  uint uVar3;
  TCGv_i64 ret;
  byte bVar4;
  uint32_t maxsz;
  uint oprsz;
  int iVar5;
  ulong uVar6;
  uint64_t arg;
  uint64_t local_58;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (!_Var1) {
    return _Var1;
  }
  fullsz = s->sve_len;
  iVar2 = rd * 0x20;
  uVar3 = decode_pred_count(fullsz,pat,esz);
  if (uVar3 == 0) {
    local_58 = 0;
    uVar6 = (ulong)fullsz;
    arg = 0;
  }
  else {
    uVar3 = uVar3 << ((byte)esz & 0x1f);
    uVar6 = (ulong)uVar3;
    local_58 = pred_esz_masks_aarch64[esz];
    uVar3 = uVar3 & 0x3f;
    arg = local_58;
    if (uVar3 != 0) {
      bVar4 = -(char)uVar3;
      arg = (local_58 << (bVar4 & 0x3f)) >> (bVar4 & 0x3f);
    }
  }
  ret = tcg_temp_new_i64(tcg_ctx);
  if (fullsz < 0x41) {
    tcg_gen_movi_i64_aarch64(tcg_ctx,ret,arg);
    tcg_gen_st_i64_aarch64(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(iVar2 + 0x2c10U));
  }
  else {
    uVar3 = (uint)(uVar6 >> 3);
    if (local_58 == arg) {
      oprsz = uVar3 + 0xf & 0xfffffff0;
      if ((uint)uVar6 < 0x48) {
        oprsz = 8;
      }
      if (oprsz * 8 == (uint)uVar6) {
        maxsz = 8;
        if (0x47 < fullsz) {
          maxsz = (fullsz >> 3) + 0xf & 0xfffffff0;
        }
        tcg_gen_gvec_dup64i_aarch64(tcg_ctx,iVar2 + 0x2c10U,oprsz,maxsz,local_58);
        goto LAB_0060a456;
      }
    }
    tcg_gen_movi_i64_aarch64(tcg_ctx,ret,local_58);
    for (uVar6 = 0; iVar5 = (int)uVar6, uVar6 < (uVar3 & 0xfffffff8); uVar6 = uVar6 + 8) {
      tcg_gen_st_i64_aarch64(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(uint)(iVar2 + 0x2c10 + iVar5));
    }
    if (local_58 != arg) {
      tcg_gen_movi_i64_aarch64(tcg_ctx,ret,arg);
      tcg_gen_st_i64_aarch64(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(iVar2 + iVar5 + 0x2c10));
      uVar6 = (ulong)(iVar5 + 8);
    }
    if ((uint)uVar6 < fullsz >> 3) {
      tcg_gen_movi_i64_aarch64(tcg_ctx,ret,0);
      for (uVar6 = uVar6 & 0xffffffff; uVar6 < fullsz >> 3; uVar6 = uVar6 + 8) {
        tcg_gen_st_i64_aarch64
                  (tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(uint)(iVar2 + 0x2c10 + (int)uVar6));
      }
    }
  }
LAB_0060a456:
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  if (!setflag) {
    return (_Bool)extraout_AL;
  }
  tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_NF,-(uint)(local_58 != 0));
  tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_CF,(uint)(local_58 == 0));
  tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_VF,0);
  tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_ZF,tcg_ctx->cpu_NF);
  return (_Bool)extraout_AL_00;
}

Assistant:

static bool do_predset(DisasContext *s, int esz, int rd, int pat, bool setflag)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned fullsz = vec_full_reg_size(s);
    unsigned ofs = pred_full_reg_offset(s, rd);
    unsigned numelem, setsz, i;
    uint64_t word, lastword;
    TCGv_i64 t;

    numelem = decode_pred_count(fullsz, pat, esz);

    /* Determine what we must store into each bit, and how many.  */
    if (numelem == 0) {
        lastword = word = 0;
        setsz = fullsz;
    } else {
        setsz = numelem << esz;
        lastword = word = pred_esz_masks[esz];
        if (setsz % 64) {
            lastword &= MAKE_64BIT_MASK(0, setsz % 64);
        }
    }

    t = tcg_temp_new_i64(tcg_ctx);
    if (fullsz <= 64) {
        tcg_gen_movi_i64(tcg_ctx, t, lastword);
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs);
        goto done;
    }

    if (word == lastword) {
        unsigned maxsz = size_for_gvec(fullsz / 8);
        unsigned oprsz = size_for_gvec(setsz / 8);

        if (oprsz * 8 == setsz) {
            tcg_gen_gvec_dup64i(tcg_ctx, ofs, oprsz, maxsz, word);
            goto done;
        }
    }

    setsz /= 8;
    fullsz /= 8;

    tcg_gen_movi_i64(tcg_ctx, t, word);
    for (i = 0; i < QEMU_ALIGN_DOWN(setsz, 8); i += 8) {
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
    }
    if (lastword != word) {
        tcg_gen_movi_i64(tcg_ctx, t, lastword);
        tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
        i += 8;
    }
    if (i < fullsz) {
        tcg_gen_movi_i64(tcg_ctx, t, 0);
        for (; i < fullsz; i += 8) {
            tcg_gen_st_i64(tcg_ctx, t, tcg_ctx->cpu_env, ofs + i);
        }
    }

 done:
    tcg_temp_free_i64(tcg_ctx, t);

    /* PTRUES */
    if (setflag) {
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_NF, -(word != 0));
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_CF, word == 0);
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_VF, 0);
        tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    }
    return true;
}